

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O1

_Bool M680X_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *inst_info)

{
  inst_page1 iVar1;
  inst_pageX iVar2;
  insn_props iVar3;
  m680x_insn mVar4;
  m680x_op_type mVar5;
  m680x_info *info;
  cs_detail *pcVar6;
  cpu_tables *pcVar7;
  size_t sVar8;
  inst_pageX *piVar9;
  _Bool *p_Var10;
  m680x_info *pmVar11;
  MCInst *pMVar12;
  _Bool _Var13;
  long lVar14;
  ulong uVar15;
  byte bVar16;
  ushort uVar17;
  ushort uVar18;
  int iVar19;
  m680x_reg mVar20;
  e_access access;
  int iVar21;
  uint uVar22;
  int iVar23;
  undefined4 *puVar24;
  cs_m680x_op *pcVar25;
  byte bVar26;
  uint8_t *puVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  size_t sVar33;
  uint16_t uVar34;
  int i;
  bool bVar35;
  byte bVar36;
  ushort local_8c;
  uint16_t local_8a;
  insn_desc local_88;
  MCInst *local_68;
  int local_5c;
  size_t local_58;
  ulong local_50;
  uint16_t *local_48;
  cs_detail *local_40;
  ulong local_38;
  
  info = *(m680x_info **)(ud + 0x10);
  local_68 = MI;
  local_58 = code_len;
  local_50 = address;
  MCInst_clear(MI);
  uVar28 = local_50;
  sVar33 = local_58;
  uVar22 = *(uint *)(ud + 4);
  uVar29 = 0;
  if ((uVar22 & 8) == 0) {
    if ((uVar22 & 0x10) == 0) {
      if ((uVar22 & 0x20) == 0) {
        if ((uVar22 & 0x40) == 0) {
          if ((uVar22 >> 10 & 1) == 0) {
            if ((char)uVar22 < '\0') {
              uVar15 = 7;
            }
            else if ((uVar22 & 2) == 0) {
              if ((uVar22 & 4) == 0) {
                if ((uVar22 >> 8 & 1) == 0) {
                  bVar35 = (uVar22 >> 9 & 1) == 0;
                  uVar15 = (ulong)((int)(uVar22 << 0x16) >> 0x1f & 9);
                  goto LAB_0026f40a;
                }
                uVar15 = 8;
              }
              else {
                uVar15 = 2;
              }
            }
            else {
              uVar15 = 1;
            }
          }
          else {
            uVar15 = 10;
          }
        }
        else {
          uVar15 = 6;
        }
      }
      else {
        uVar15 = 5;
      }
    }
    else {
      uVar15 = 4;
    }
    bVar35 = false;
  }
  else {
    uVar15 = 3;
    bVar35 = false;
  }
LAB_0026f40a:
  if (!bVar35) {
    info->code = code;
    info->size = (uint)local_58 & 0xffff;
    uVar34 = (uint16_t)local_50;
    info->offset = uVar34;
    info->cpu_type = (e_cpu_type)uVar15;
    info->cpu = g_cpu_tables + uVar15;
    pcVar6 = local_68->flat_insn->detail;
    local_8a = uVar34;
    if (pcVar6 != (cs_detail *)0x0) {
      memset(pcVar6,0,0x134);
    }
    local_88.opcode = 0;
    local_88.insn = M680X_INS_INVLD;
    local_88.hid[0] = illgl_hid;
    local_88.hid[1] = illgl_hid;
    local_88.insn_size = 0;
    local_88._18_2_ = 0;
    memset(&info->m680x,0,0xdc);
    info->insn_size = '\x01';
    iVar31 = (int)uVar28;
    iVar21 = iVar31 + 1;
    local_38 = uVar28 & 0xffff;
    lVar14 = local_38 - info->offset;
    if ((uint)lVar14 < info->size) {
      bVar36 = info->code[lVar14];
      pcVar7 = info->cpu;
      local_88.insn = M680X_INS_ILLGL;
      mVar4 = local_88.insn;
      local_88.opcode = (uint)bVar36;
      local_88.insn = M680X_INS_ILLGL;
      lVar14 = -3;
      do {
        iVar19 = iVar21;
        if ((pcVar7->pageX_table_size[lVar14 + 3] == 0) ||
           (sVar8 = pcVar7->pageX_table_size[lVar14], sVar8 == 0)) break;
        if (pcVar7->pageX_prefix[lVar14 + 3] == bVar36) {
          lVar30 = (ulong)(ushort)iVar21 - (ulong)info->offset;
          if (info->size <= (uint)lVar30) goto LAB_0026fff9;
          bVar16 = info->code[lVar30];
          local_88.opcode = (uint32_t)CONCAT11(bVar36,bVar16);
          iVar19 = (int)pcVar7->pageX_table_size[lVar14 + 3];
          uVar22 = 0xffffffff;
          if (iVar19 < 1) goto LAB_0026ffc2;
          iVar19 = iVar19 + -1;
          iVar32 = 0;
          iVar23 = iVar19;
          goto LAB_0026f614;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0);
      goto LAB_0026f505;
    }
    goto LAB_0026fff9;
  }
  goto LAB_00270061;
LAB_0026f614:
  do {
    uVar22 = iVar19 / 2;
    bVar36 = *(byte *)(sVar8 + (long)(int)uVar22 * 4);
    if (bVar36 < bVar16) {
      iVar32 = uVar22 + 1;
    }
    else {
      if (bVar36 == bVar16) break;
      iVar23 = uVar22 - 1;
    }
    iVar19 = iVar23 + iVar32;
    uVar22 = 0xffffffff;
  } while (iVar32 <= iVar23);
LAB_0026ffc2:
  local_88.insn = mVar4;
  if (-1 < (int)uVar22) {
    uVar22 = *(uint *)(sVar8 + (ulong)uVar22 * 4);
    local_88.hid = (insn_hdlr_id  [2])(CONCAT44(uVar22 >> 0x17,uVar22 >> 0x11) & 0x3f0000003f);
    local_88.insn = uVar22 >> 8 & (M680X_INS_PSHY|M680X_INS_PSHX);
    iVar19 = iVar31 + 2;
    bVar36 = bVar16;
LAB_0026f505:
    if (local_88.insn == M680X_INS_ILLGL) {
      iVar1 = pcVar7->inst_page1_table[bVar36];
      local_88.insn = (uint)iVar1 & (M680X_INS_PSHY|M680X_INS_PSHX);
      local_88.hid = (insn_hdlr_id  [2])
                     (CONCAT44((uint)iVar1 >> 0xf,(uint)iVar1 >> 9) & 0x3f0000003f);
    }
    local_5c = iVar21;
    if (local_88.insn == M680X_INS_ILLGL) {
      lVar14 = 0;
      do {
        if ((pcVar7->overlay_table_size[lVar14] == 0) ||
           (piVar9 = pcVar7->inst_overlay_table[lVar14], piVar9 == (inst_pageX *)0x0)) break;
        uVar28 = 0xffffffff;
        iVar31 = (int)pcVar7->overlay_table_size[lVar14];
        if (0 < iVar31) {
          iVar31 = iVar31 + -1;
          iVar23 = 0;
          iVar21 = iVar31;
          do {
            uVar22 = iVar31 / 2;
            if (*(byte *)(piVar9 + (int)uVar22) < bVar36) {
              iVar23 = uVar22 + 1;
            }
            else {
              if (*(byte *)(piVar9 + (int)uVar22) == bVar36) {
                uVar28 = (ulong)uVar22;
                break;
              }
              iVar21 = uVar22 - 1;
            }
            iVar31 = iVar21 + iVar23;
          } while (iVar23 <= iVar21);
        }
        if (-1 < (int)uVar28) {
          iVar2 = piVar9[uVar28];
          local_88.hid = (insn_hdlr_id  [2])
                         (CONCAT44((uint)iVar2 >> 0x17,(uint)iVar2 >> 0x11) & 0x3f0000003f);
          local_88.insn = (uint)iVar2 >> 8 & (M680X_INS_PSHY|M680X_INS_PSHX);
          break;
        }
        bVar35 = lVar14 == 0;
        lVar14 = lVar14 + 1;
      } while (bVar35);
    }
    local_88.insn_size = (ushort)iVar19 - uVar34;
    if ((local_88.insn != M680X_INS_INVLD) && (local_88.insn != M680X_INS_ILLGL)) {
      local_40 = pcVar6;
      local_48 = size;
      lVar14 = 2;
      local_8c = (ushort)iVar19;
      do {
        uVar34 = local_88.insn_size;
        bVar36 = 1;
        switch(local_88.hid[lVar14 + -2]) {
        case illgl_hid:
        case inh_hid:
        case opidx_hid:
        case idxX0_hid:
        case idxX0p_hid:
          break;
        case rel8_hid:
        case imm8_hid:
        case dir_hid:
        case idxX_hid:
        case idxY_hid:
        case rbits_hid:
        case idxS_hid:
        case idxXp_hid:
        case index_hid:
          local_88.insn_size = local_88.insn_size + 1;
          bVar36 = (uint)local_8c - (uint)info->offset < info->size;
          local_8c = local_8c + 1;
          break;
        case rel16_hid:
        case imm16_hid:
        case ext_hid:
        case opidxdr_hid:
        case idxX16_hid:
        case imm8rel_hid:
        case idxS16_hid:
          local_88.insn_size = local_88.insn_size + 2;
          bVar36 = (local_8c + 1 & 0xffff) - (uint)info->offset < info->size;
LAB_0026f712:
          local_8c = local_8c + 2;
          break;
        case imm32_hid:
          local_88.insn_size = local_88.insn_size + 4;
          bVar36 = (local_8c + 3 & 0xffff) - (uint)info->offset < info->size;
          local_8c = local_8c + 4;
          break;
        case idx09_hid:
          local_88.insn_size = local_88.insn_size + 1;
          uVar18 = local_8c + 1;
          uVar17 = info->offset;
          uVar22 = info->size;
          if (uVar22 <= (uint)((ulong)local_8c - (ulong)uVar17)) goto switchD_0026fa3c_caseD_87;
          uVar29 = (uint)(info->code[(ulong)local_8c - (ulong)uVar17] & 0x9f);
          if (uVar29 - 0x87 < 0x19) {
            switch(uVar29) {
            default:
              goto switchD_0026fa3c_caseD_87;
            case 0x88:
            case 0x8c:
            case 0x98:
            case 0x9c:
              local_88.insn_size = uVar34 + 2;
              local_8c = local_8c + 2;
              bVar36 = (uint)uVar18 - (uint)uVar17 < uVar22;
              goto switchD_0026f6cf_caseD_0;
            case 0x89:
            case 0x8d:
            case 0x99:
            case 0x9d:
              bVar36 = (local_8c + 2 & 0xffff) - (uint)uVar17 < uVar22;
              break;
            case 0x8b:
            case 0x91:
            case 0x93:
            case 0x94:
            case 0x95:
            case 0x96:
            case 0x9b:
              goto switchD_0026fa3c_caseD_8b;
            case 0x9f:
              bVar36 = (local_8c + 2 & 0xffff) - (uint)uVar17 < uVar22 &&
                       (info->code[(ulong)local_8c - (ulong)uVar17] & 0x60) == 0;
            }
            local_88.insn_size = uVar34 + 3;
            local_8c = local_8c + 3;
          }
          else {
switchD_0026fa3c_caseD_8b:
            bVar36 = 1;
            local_8c = uVar18;
          }
          break;
        case rr09_hid:
          local_88.insn_size = local_88.insn_size + 1;
          uVar17 = local_8c + 1;
          lVar30 = (ulong)local_8c - (ulong)info->offset;
          if (info->size <= (uint)lVar30) goto switchD_0026fa3c_caseD_87;
          p_Var10 = info->cpu->tfr_reg_valid;
          local_8c = uVar17;
          if (p_Var10 != (_Bool *)0x0) {
            bVar36 = p_Var10[info->code[lVar30] >> 4];
            if ((_Bool)bVar36 == true) {
              bVar36 = p_Var10[info->code[lVar30] & 0xf];
            }
          }
          break;
        case bitmv_hid:
          local_88.insn_size = local_88.insn_size + 2;
          uVar17 = info->offset;
          uVar22 = info->size;
          if ((uVar22 <= (uint)((ulong)local_8c - (ulong)uVar17)) ||
             (0xbf < info->code[(ulong)local_8c - (ulong)uVar17])) goto switchD_0026fa3c_caseD_87;
LAB_0026faa9:
          uVar18 = local_8c + 1;
          local_8c = local_8c + 2;
          bVar36 = (uint)uVar18 - (uint)uVar17 < uVar22;
          break;
        case tfm_hid:
          local_88.insn_size = local_88.insn_size + 1;
          uVar28 = (ulong)local_8c;
          local_8c = local_8c + 1;
          lVar30 = uVar28 - info->offset;
          uVar22 = (uint)lVar30;
          if (uVar22 < info->size) {
            bVar16 = info->code[lVar30];
          }
          else {
            bVar16 = 0;
          }
          bVar36 = 0;
          if ((uVar22 < info->size) && (bVar16 < 0x50)) {
            bVar36 = (bVar16 & 0xf) < 5;
          }
          break;
        case idx12_hid:
          _Var13 = false;
          goto LAB_0026f946;
        case idx12s_hid:
          _Var13 = true;
LAB_0026f946:
          local_88.insn_size = local_88.insn_size + 1;
          lVar30 = (ulong)local_8c - (ulong)info->offset;
          if ((uint)lVar30 < info->size) {
            local_8c = local_8c + 1;
            bVar36 = is_indexed12_post_byte_valid
                               (info,&local_8c,info->code[lVar30],&local_88,_Var13);
          }
          else {
switchD_0026fa3c_caseD_87:
            local_8c = local_8c + 1;
            bVar36 = 0;
          }
          break;
        case rr12_hid:
          local_88.insn_size = local_88.insn_size + 1;
          lVar30 = (ulong)local_8c - (ulong)info->offset;
          if (info->size <= (uint)lVar30) goto switchD_0026fa3c_caseD_87;
          bVar36 = info->code[lVar30] >> 3 ^ 1;
          local_8c = local_8c + 1;
          break;
        case loop_hid:
          local_88.insn_size = local_88.insn_size + 2;
          uVar17 = info->offset;
          uVar22 = info->size;
          if (((uint)((ulong)local_8c - (ulong)uVar17) < uVar22) &&
             ((info->code[(ulong)local_8c - (ulong)uVar17] & 6) != 2 &&
              info->code[(ulong)local_8c - (ulong)uVar17] < 0xc0)) goto LAB_0026faa9;
          goto switchD_0026fa3c_caseD_87;
        case imm8i12x_hid:
          local_88.insn_size = local_88.insn_size + 1;
          uVar17 = info->offset;
          lVar30 = (ulong)local_8c - (ulong)uVar17;
          uVar22 = info->size;
          if (uVar22 <= (uint)lVar30) goto switchD_0026fa3c_caseD_87;
          bVar36 = 0;
          local_8c = local_8c + 1;
          _Var13 = is_indexed12_post_byte_valid(info,&local_8c,info->code[lVar30],&local_88,false);
          if (_Var13) {
            local_88.insn_size = local_88.insn_size + 1;
            bVar36 = (uint)local_8c - (uint)uVar17 < uVar22;
            local_8c = local_8c + 1;
          }
          break;
        case imm16i12x_hid:
        case exti12x_hid:
          local_88.insn_size = local_88.insn_size + 1;
          uVar17 = info->offset;
          lVar30 = (ulong)local_8c - (ulong)uVar17;
          uVar22 = info->size;
          if (uVar22 <= (uint)lVar30) goto switchD_0026fa3c_caseD_87;
          bVar36 = 0;
          local_8c = local_8c + 1;
          _Var13 = is_indexed12_post_byte_valid(info,&local_8c,info->code[lVar30],&local_88,false);
          if (_Var13) {
            local_88.insn_size = local_88.insn_size + 2;
            bVar36 = (local_8c + 1 & 0xffff) - (uint)uVar17 < uVar22;
            goto LAB_0026f712;
          }
          break;
        default:
          bVar36 = 0;
          fprintf(_stderr,"Internal error: Unexpected instruction handler id %d\n");
        }
switchD_0026f6cf_caseD_0:
        pcVar6 = local_40;
      } while ((lVar14 == 2) && (lVar14 = 3, (bVar36 & 1) != 0));
      sVar33 = local_58;
      size = local_48;
      if ((bVar36 & 1) != 0) {
        local_8a = (local_8a - (local_88.opcode < 0x100)) + 2;
        info->insn = local_88.insn;
        MCInst_setOpcode(local_68,local_88.opcode);
        pMVar12 = local_68;
        iVar3 = g_insn_props[info->insn];
        mVar20 = (uint)iVar3 >> 9 & (M680X_REG_U|M680X_REG_S);
        if (mVar20 != M680X_REG_INVALID) {
          if (mVar20 == M680X_REG_HX) {
            mVar20 = (uint)(info->cpu->reg_byte_size[0xb] == '\0') * 2 + M680X_REG_HX;
          }
          bVar36 = (info->m680x).op_count;
          bVar26 = bVar36 + 1;
          (info->m680x).op_count = bVar26;
          (info->m680x).operands[bVar36].type = M680X_OP_REGISTER;
          (info->m680x).operands[bVar36].field_1.reg = mVar20;
          puVar27 = info->cpu->reg_byte_size;
          (info->m680x).operands[bVar36].size = puVar27[mVar20];
          bVar16 = (info->m680x).flags;
          (info->m680x).flags = bVar16 | 1;
          mVar20 = (uint)iVar3 >> 0xe & (M680X_REG_U|M680X_REG_S);
          if (mVar20 != M680X_REG_INVALID) {
            if (mVar20 == M680X_REG_HX) {
              mVar20 = (uint)(puVar27[0xb] == '\0') * 2 + M680X_REG_HX;
            }
            (info->m680x).op_count = bVar36 + 2;
            (info->m680x).operands[bVar26].type = M680X_OP_REGISTER;
            (info->m680x).operands[bVar26].field_1.reg = mVar20;
            (info->m680x).operands[bVar26].size = info->cpu->reg_byte_size[mVar20];
            (info->m680x).flags = bVar16 | 3;
          }
        }
        (*g_insn_handler[(ulong)local_88.hid & 0xffffffff])(local_68,info,&local_8a);
        (*g_insn_handler[(ulong)local_88.hid >> 0x20])(pMVar12,info,&local_8a);
        if ((pcVar6 != (cs_detail *)0x0) &&
           (iVar3 = g_insn_props[info->insn], ((uint)iVar3 & 7) != 0)) {
          bVar36 = pcVar6->groups_count;
          pcVar6->groups_count = bVar36 + 1;
          pcVar6->groups[bVar36] = iVar3._0_1_ & 0xf;
        }
        mVar4 = info->insn;
        if ((((g_insn_props[mVar4].field_0x2 & 8) != 0) &&
            (info->cpu->insn_cc_not_modified[0] != mVar4)) &&
           (info->cpu->insn_cc_not_modified[1] != mVar4)) {
          add_reg_to_rw_list(local_68,M680X_REG_CC,MODIFY);
        }
        mVar4 = info->insn;
        if ((info->cpu->insn_cc_not_modified[0] == mVar4) ||
           (info->cpu->insn_cc_not_modified[1] == mVar4)) {
          uVar22 = 5;
        }
        else {
          uVar22 = (uint)g_insn_props[mVar4] >> 4 & 0x1f;
        }
        if ((local_68->flat_insn->detail != (cs_detail *)0x0) && ((info->m680x).op_count != '\0')) {
          uVar28 = 0;
          pmVar11 = info;
          do {
            pcVar25 = (pmVar11->m680x).operands;
            uVar15 = 3;
            if ((int)uVar28 < 3) {
              uVar15 = uVar28 & 0xffffffff;
            }
            if (local_68->flat_insn->detail != (cs_detail *)0x0) {
              mVar5 = pcVar25->type;
              if (mVar5 == M680X_OP_INDEXED) {
                add_reg_to_rw_list(local_68,(pmVar11->m680x).operands[0].field_1.reg,READ);
                if (((pmVar11->m680x).operands[0].field_1.imm == 0xd) &&
                   (info->cpu->reg_byte_size[0xc] != '\0')) {
                  add_reg_to_rw_list(local_68,M680X_REG_H,READ);
                }
                mVar20 = (pmVar11->m680x).operands[0].field_1.idx.offset_reg;
                if (mVar20 != M680X_REG_INVALID) {
                  add_reg_to_rw_list(local_68,mVar20,READ);
                }
                if ((((pmVar11->m680x).operands[0].field_1.idx.inc_dec != '\0') &&
                    (add_reg_to_rw_list(local_68,(pmVar11->m680x).operands[0].field_1.reg,WRITE),
                    (pmVar11->m680x).operands[0].field_1.imm == 0xd)) &&
                   (info->cpu->reg_byte_size[0xc] != '\0')) {
                  mVar20 = M680X_REG_H;
                  access = WRITE;
                  goto LAB_0026fd9c;
                }
              }
              else if (mVar5 == M680X_OP_REGISTER) {
                access = g_access_mode_to_access[uVar15][uVar22];
                mVar20 = (pmVar11->m680x).operands[0].field_1.reg;
LAB_0026fd9c:
                add_reg_to_rw_list(local_68,mVar20,access);
              }
            }
            uVar28 = uVar28 + 1;
            pmVar11 = (m680x_info *)pcVar25;
          } while (uVar28 < (info->m680x).op_count);
        }
        pcVar6 = local_68->flat_insn->detail;
        if (((pcVar6 != (cs_detail *)0x0) && (uVar22 != 0)) &&
           (bVar36 = (info->m680x).op_count, bVar36 != 0)) {
          mVar4 = info->insn;
          puVar27 = &(info->m680x).operands[0].access;
          uVar28 = 0;
          iVar31 = 0;
          do {
            iVar21 = iVar31;
            if (uVar28 == 1) {
              iVar21 = 1;
            }
            if (mVar4 != M680X_INS_MULD) {
              iVar21 = iVar31;
            }
            iVar31 = iVar21;
            iVar21 = (int)uVar28 + iVar31;
            if (2 < iVar21) {
              iVar21 = 3;
            }
            *puVar27 = (char)g_access_mode_to_access[iVar21][uVar22];
            uVar28 = uVar28 + 1;
            puVar27 = puVar27 + 0x18;
          } while (bVar36 != uVar28);
        }
        if ((pcVar6 != (cs_detail *)0x0) && (((uint)g_insn_props[info->insn] & 0x100000) != 0)) {
          puVar24 = &DAT_0059cefc;
          lVar14 = 0;
          do {
            if ((info->insn == (&set_changed_regs_read_write_counts_changed_regs)[lVar14 * 0xc]) &&
               (mVar20 = (&DAT_0059cef8)[lVar14 * 0xc], mVar20 != M680X_REG_INVALID)) {
              uVar22 = (&DAT_0059cef4)[lVar14 * 0xc];
              uVar28 = 0;
              do {
                if ((info->cpu->reg_byte_size[mVar20] != '\0') ||
                   (mVar20 = M680X_REG_X, info->insn == M680X_INS_MUL)) {
                  uVar15 = 3;
                  if ((int)uVar28 < 3) {
                    uVar15 = uVar28 & 0xffffffff;
                  }
                  add_reg_to_rw_list(local_68,mVar20,g_access_mode_to_access[uVar15][uVar22]);
                }
                mVar20 = puVar24[uVar28];
                uVar28 = uVar28 + 1;
              } while (mVar20 != M680X_REG_INVALID);
            }
            lVar14 = lVar14 + 1;
            puVar24 = puVar24 + 0xc;
          } while (lVar14 != 0x33);
        }
        uVar29 = (uint)(byte)local_88.insn_size;
        info->insn_size = (byte)local_88.insn_size;
        sVar33 = local_58;
        size = local_48;
        goto LAB_00270061;
      }
    }
  }
LAB_0026fff9:
  MCInst_setOpcode(local_68,local_88.opcode);
  bVar36 = (info->m680x).op_count;
  (info->m680x).op_count = bVar36 + 1;
  info->insn = M680X_INS_ILLGL;
  lVar14 = (local_38 & 0xffffffff) - (ulong)info->offset;
  uVar22 = 0;
  if ((uint)lVar14 < info->size) {
    uVar22 = (uint)info->code[lVar14];
  }
  (info->m680x).operands[bVar36].field_1.imm = uVar22;
  (info->m680x).operands[bVar36].type = M680X_OP_IMMEDIATE;
  (info->m680x).operands[bVar36].size = '\x01';
  uVar29 = 1;
LAB_00270061:
  if (uVar29 == 0) {
    sVar33 = 1;
  }
  else if (uVar29 <= sVar33) {
    _Var13 = true;
    uVar34 = (uint16_t)uVar29;
    goto LAB_0027007a;
  }
  uVar34 = (uint16_t)sVar33;
  _Var13 = false;
LAB_0027007a:
  *size = uVar34;
  return _Var13;
}

Assistant:

bool M680X_getInstruction(csh ud, const uint8_t *code, size_t code_len,
	MCInst *MI, uint16_t *size, uint64_t address, void *inst_info)
{
	unsigned int insn_size = 0;
	e_cpu_type cpu_type = M680X_CPU_TYPE_INVALID; // No default CPU type
	cs_struct *handle = (cs_struct *)ud;
	m680x_info *info = (m680x_info *)handle->printer_info;

	MCInst_clear(MI);

	if (handle->mode & CS_MODE_M680X_6800)
		cpu_type = M680X_CPU_TYPE_6800;

	else if (handle->mode & CS_MODE_M680X_6801)
		cpu_type = M680X_CPU_TYPE_6801;

	else if (handle->mode & CS_MODE_M680X_6805)
		cpu_type = M680X_CPU_TYPE_6805;

	else if (handle->mode & CS_MODE_M680X_6808)
		cpu_type = M680X_CPU_TYPE_6808;

	else if (handle->mode & CS_MODE_M680X_HCS08)
		cpu_type = M680X_CPU_TYPE_HCS08;

	else if (handle->mode & CS_MODE_M680X_6809)
		cpu_type = M680X_CPU_TYPE_6809;

	else if (handle->mode & CS_MODE_M680X_6301)
		cpu_type = M680X_CPU_TYPE_6301;

	else if (handle->mode & CS_MODE_M680X_6309)
		cpu_type = M680X_CPU_TYPE_6309;

	else if (handle->mode & CS_MODE_M680X_6811)
		cpu_type = M680X_CPU_TYPE_6811;

	else if (handle->mode & CS_MODE_M680X_CPU12)
		cpu_type = M680X_CPU_TYPE_CPU12;

	if (cpu_type != M680X_CPU_TYPE_INVALID &&
		m680x_setup_internals(info, cpu_type, (uint16_t)address, code,
			code_len))
		insn_size = m680x_disassemble(MI, info, (uint16_t)address);

	if (insn_size == 0) {
		*size = 1;
		return false;
	}

	// Make sure we always stay within range
	if (insn_size > code_len) {
		*size = (uint16_t)code_len;
		return false;
	}
	else
		*size = (uint16_t)insn_size;

	return true;
}